

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::align_struct
          (CompilerMSL *this,SPIRType *ib_type,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *aligned_structs)

{
  uint uVar1;
  ID *__k;
  ulong uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  const_iterator cVar7;
  SPIRType *ib_type_00;
  CompilerError *this_00;
  int iVar8;
  uint32_t padding_bytes;
  uint32_t value;
  uint32_t uVar9;
  __hashtable *__h;
  ulong uVar10;
  MemberSorter member_sorter;
  uint32_t local_4c;
  MemberSorter local_48;
  
  local_48.type = (SPIRType *)CONCAT44(local_48.type._4_4_,(ib_type->super_IVariant).self.id);
  cVar7 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&aligned_structs->_M_h,(key_type *)&local_48);
  if (cVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    __k = &(ib_type->super_IVariant).self;
    local_4c = (ib_type->super_IVariant).self.id;
    local_48.type = (SPIRType *)aligned_structs;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)aligned_structs,&local_4c,&local_48);
    local_48.meta =
         ::std::__detail::
         _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
    local_48.sort_aspect = Offset;
    uVar2 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    uVar10 = ((local_48.meta)->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size;
    if (uVar10 < uVar2) {
      uVar10 = uVar2;
    }
    local_48.type = ib_type;
    SmallVector<spirv_cross::Meta::Decoration,_0UL>::resize(&(local_48.meta)->members,uVar10);
    MemberSorter::sort(&local_48);
    uVar2 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    uVar3 = (uint)uVar2;
    if (uVar3 != 0) {
      uVar10 = 0;
      do {
        ib_type_00 = Variant::get<spirv_cross::SPIRType>
                               ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr +
                                (ib_type->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                                [uVar10].id);
        if (ib_type_00->basetype == Struct) {
          align_struct(this,ib_type_00,aligned_structs);
        }
        uVar10 = uVar10 + 1;
      } while ((uVar2 & 0xffffffff) != uVar10);
      if (uVar3 != 0) {
        iVar8 = 0;
        uVar6 = 0;
        do {
          ensure_member_packing_rules_msl(this,ib_type,uVar6);
          uVar4 = get_declared_struct_member_alignment_msl(this,ib_type,uVar6);
          uVar9 = (iVar8 + uVar4) - 1 & -uVar4;
          uVar5 = Compiler::get_member_decoration
                            ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar6,
                             DecorationOffset);
          value = uVar5 - uVar9;
          if (uVar5 < uVar9 || value == 0) {
            if (uVar5 < uVar9) {
              this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (this_00,"Cannot represent buffer block correctly in MSL.");
              __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          else {
            Compiler::set_extended_member_decoration
                      ((Compiler *)this,__k->id,uVar6,SPIRVCrossDecorationPaddingTarget,value);
            iVar8 = iVar8 + value;
            uVar9 = (uVar4 - 1) + iVar8 & -uVar4;
          }
          if (uVar9 != uVar5) {
            __assert_fail("aligned_msl_offset == spirv_mbr_offset",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                          ,0x13a3,
                          "void spirv_cross::CompilerMSL::align_struct(SPIRType &, unordered_set<uint32_t> &)"
                         );
          }
          uVar1 = uVar6 + 1;
          if (uVar1 < uVar3) {
            uVar6 = get_declared_struct_member_size_msl(this,ib_type,uVar6);
            iVar8 = uVar6 + uVar5;
          }
          uVar6 = uVar1;
        } while (uVar3 != uVar1);
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::align_struct(SPIRType &ib_type, unordered_set<uint32_t> &aligned_structs)
{
	// We align structs recursively, so stop any redundant work.
	ID &ib_type_id = ib_type.self;
	if (aligned_structs.count(ib_type_id))
		return;
	aligned_structs.insert(ib_type_id);

	// Sort the members of the interface structure by their offset.
	// They should already be sorted per SPIR-V spec anyway.
	MemberSorter member_sorter(ib_type, ir.meta[ib_type_id], MemberSorter::Offset);
	member_sorter.sort();

	auto mbr_cnt = uint32_t(ib_type.member_types.size());

	for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
	{
		// Pack any dependent struct types before we pack a parent struct.
		auto &mbr_type = get<SPIRType>(ib_type.member_types[mbr_idx]);
		if (mbr_type.basetype == SPIRType::Struct)
			align_struct(mbr_type, aligned_structs);
	}

	// Test the alignment of each member, and if a member should be closer to the previous
	// member than the default spacing expects, it is likely that the previous member is in
	// a packed format. If so, and the previous member is packable, pack it.
	// For example ... this applies to any 3-element vector that is followed by a scalar.
	uint32_t msl_offset = 0;
	for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
	{
		// This checks the member in isolation, if the member needs some kind of type remapping to conform to SPIR-V
		// offsets, array strides and matrix strides.
		ensure_member_packing_rules_msl(ib_type, mbr_idx);

		// Align current offset to the current member's default alignment. If the member was packed, it will observe
		// the updated alignment here.
		uint32_t msl_align_mask = get_declared_struct_member_alignment_msl(ib_type, mbr_idx) - 1;
		uint32_t aligned_msl_offset = (msl_offset + msl_align_mask) & ~msl_align_mask;

		// Fetch the member offset as declared in the SPIRV.
		uint32_t spirv_mbr_offset = get_member_decoration(ib_type_id, mbr_idx, DecorationOffset);
		if (spirv_mbr_offset > aligned_msl_offset)
		{
			// Since MSL and SPIR-V have slightly different struct member alignment and
			// size rules, we'll pad to standard C-packing rules with a char[] array. If the member is farther
			// away than C-packing, expects, add an inert padding member before the the member.
			uint32_t padding_bytes = spirv_mbr_offset - aligned_msl_offset;
			set_extended_member_decoration(ib_type_id, mbr_idx, SPIRVCrossDecorationPaddingTarget, padding_bytes);

			// Re-align as a sanity check that aligning post-padding matches up.
			msl_offset += padding_bytes;
			aligned_msl_offset = (msl_offset + msl_align_mask) & ~msl_align_mask;
		}
		else if (spirv_mbr_offset < aligned_msl_offset)
		{
			// This should not happen, but deal with unexpected scenarios.
			// It *might* happen if a sub-struct has a larger alignment requirement in MSL than SPIR-V.
			SPIRV_CROSS_THROW("Cannot represent buffer block correctly in MSL.");
		}

		assert(aligned_msl_offset == spirv_mbr_offset);

		// Increment the current offset to be positioned immediately after the current member.
		// Don't do this for the last member since it can be unsized, and it is not relevant for padding purposes here.
		if (mbr_idx + 1 < mbr_cnt)
			msl_offset = aligned_msl_offset + get_declared_struct_member_size_msl(ib_type, mbr_idx);
	}
}